

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

_Bool realloc_array(roaring_array_t *ra,int32_t new_capacity)

{
  void **__ptr;
  void **__dest;
  void **__dest_00;
  uint8_t *__dest_01;
  uint8_t *newtypecodes;
  uint16_t *newkeys;
  container_t **newcontainers;
  void *oldbigalloc;
  void *bigalloc;
  size_t memoryneeded;
  int32_t new_capacity_local;
  roaring_array_t *ra_local;
  
  if (new_capacity == 0) {
    free(ra->containers);
    ra->containers = (void **)0x0;
    ra->keys = (uint16_t *)0x0;
    ra->typecodes = (uint8_t *)0x0;
    ra->allocation_size = 0;
    ra_local._7_1_ = true;
  }
  else {
    __dest = (void **)malloc((long)new_capacity * 0xb);
    if (__dest == (void **)0x0) {
      ra_local._7_1_ = false;
    }
    else {
      __ptr = ra->containers;
      __dest_00 = __dest + new_capacity;
      __dest_01 = (uint8_t *)((long)__dest_00 + (long)new_capacity * 2);
      if (__dest_01 + new_capacity != (uint8_t *)((long)__dest + (long)new_capacity * 0xb)) {
        __assert_fail("(char *)(newtypecodes + new_capacity) == (char *)bigalloc + memoryneeded",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                      ,0x466c,"_Bool realloc_array(roaring_array_t *, int32_t)");
      }
      if (0 < ra->size) {
        memcpy(__dest,ra->containers,(long)ra->size << 3);
        memcpy(__dest_00,ra->keys,(long)ra->size << 1);
        memcpy(__dest_01,ra->typecodes,(long)ra->size);
      }
      ra->containers = __dest;
      ra->keys = (uint16_t *)__dest_00;
      ra->typecodes = __dest_01;
      ra->allocation_size = new_capacity;
      free(__ptr);
      ra_local._7_1_ = true;
    }
  }
  return ra_local._7_1_;
}

Assistant:

static bool realloc_array(roaring_array_t *ra, int32_t new_capacity) {
    //
    // Note: not implemented using C's realloc(), because the memory layout is
    // Struct-of-Arrays vs. Array-of-Structs:
    // https://github.com/RoaringBitmap/CRoaring/issues/256

    if ( new_capacity == 0 ) {
      free(ra->containers);
      ra->containers = NULL;
      ra->keys = NULL;
      ra->typecodes = NULL;
      ra->allocation_size = 0;
      return true;
    }
    const size_t memoryneeded = new_capacity * (
                sizeof(uint16_t) + sizeof(container_t *) + sizeof(uint8_t));
    void *bigalloc = malloc(memoryneeded);
    if (!bigalloc) return false;
    void *oldbigalloc = ra->containers;
    container_t **newcontainers = (container_t **)bigalloc;
    uint16_t *newkeys = (uint16_t *)(newcontainers + new_capacity);
    uint8_t *newtypecodes = (uint8_t *)(newkeys + new_capacity);
    assert((char *)(newtypecodes + new_capacity) ==
           (char *)bigalloc + memoryneeded);
    if(ra->size > 0) {
      memcpy(newcontainers, ra->containers, sizeof(container_t *) * ra->size);
      memcpy(newkeys, ra->keys, sizeof(uint16_t) * ra->size);
      memcpy(newtypecodes, ra->typecodes, sizeof(uint8_t) * ra->size);
    }
    ra->containers = newcontainers;
    ra->keys = newkeys;
    ra->typecodes = newtypecodes;
    ra->allocation_size = new_capacity;
    free(oldbigalloc);
    return true;
}